

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void processChunkShared(Image *output,uint32_t size,Type type,int width,int height,istream *file,
                       string *name,bool isSwitch)

{
  bool bVar1;
  runtime_error *prVar2;
  long *plVar3;
  long *plVar4;
  Size size_00;
  uint uVar5;
  ulong __new_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chunk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> compressed;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  long lStack_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar5 = width + 3;
  if (size == 0) {
    if (type != TYPE_INDEXED) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar2,"Expected a size-0 type to be 3 (indexed, no alpha) but it wasn\'t...");
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_88,(ulong)(height * (uVar5 & 0xfffffffc) + 0x400),(allocator_type *)&local_50)
    ;
    std::istream::read((char *)file,
                       (long)local_88.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    getIndexed(output,&local_88,(Size)(CONCAT44(height,uVar5) & 0xfffffffffffffffc),isSwitch,0x100);
    if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_68,(ulong)size,(allocator_type *)&local_88);
    std::istream::read((char *)file,
                       (long)local_68.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    bVar1 = decompressHigu(&local_a8,
                           local_68.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           (int)local_68.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                           (int)local_68.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,isSwitch);
    if (!bVar1) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Decompression of ",name);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar3;
      plVar4 = plVar3 + 2;
      if ((long *)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start == plVar4) {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
        lStack_70 = plVar3[3];
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)&local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      else {
        local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*plVar4;
      }
      local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::runtime_error::runtime_error(prVar2,(string *)&local_88);
      __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    size_00 = (Size)(CONCAT44(height,uVar5) & 0xfffffffffffffffc);
    if ((type & ~TYPE_COLOR) == TYPE_INDEXED_ALPHA) {
      getIndexed(output,&local_a8,size_00,isSwitch,0x100);
    }
    else {
      output->size = size_00;
      std::vector<Color,_std::allocator<Color>_>::resize
                (&output->colorData,
                 (long)(((ulong)(uint)height << 0x20) * (ulong)(uVar5 & 0xfffffffc)) >> 0x20);
      __new_size = (ulong)((output->size).width * (output->size).height * 4);
      if ((ulong)((long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start) < __new_size) {
        fprintf(_stderr,"Decompressed too little data for chunk, have %zd but need %d bytes!\n");
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_a8,__new_size);
      }
      else if (__new_size <
               (ulong)((long)local_a8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_a8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
        fprintf(_stderr,"Decompressed too much data for chunk, have %zd but only need %d bytes!\n");
      }
      getRGB(output,&local_a8,isSwitch);
    }
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void processChunkShared(Image &output, uint32_t size, ChunkHeader::Type type, int width, int height, std::istream &file, const std::string &name, bool isSwitch) {
	std::vector<uint8_t> decompressed;
	Size alignedSize = align({width, height});

	// If size is zero, then we're uncompressed and paletted
	if (size == 0) {
		if (type != ChunkHeader::TYPE_INDEXED) {
			throw std::runtime_error("Expected a size-0 type to be 3 (indexed, no alpha) but it wasn't...");
		}
		size = 1024 + alignedSize.area();
		std::vector<uint8_t> chunk(size);
		file.read((char *)chunk.data(), chunk.size());
		getIndexed(output, chunk, alignedSize, isSwitch);
		return;
	}
	else {
		std::vector<uint8_t> compressed(size);
		file.read((char *)compressed.data(), compressed.size());
		if (!decompressHigu(decompressed, compressed.data(), (int)compressed.size(), isSwitch)) {
			throw std::runtime_error("Decompression of " + name + " failed");
		}
	}

	if (type == ChunkHeader::TYPE_INDEXED || type == ChunkHeader::TYPE_INDEXED_ALPHA) {
		getIndexed(output, decompressed, alignedSize, isSwitch);
	}
	else {
		output.fastResize(alignedSize);
		int byteSize = output.size.area() * sizeof(Color);
		if (decompressed.size() < byteSize) {
			fprintf(stderr, "Decompressed too little data for chunk, have %zd but need %d bytes!\n", decompressed.size(), byteSize);
			decompressed.resize(byteSize);
		}
		else if (decompressed.size() > byteSize) {
			fprintf(stderr, "Decompressed too much data for chunk, have %zd but only need %d bytes!\n", decompressed.size(), byteSize);
		}
		getRGB(output, decompressed, isSwitch);
	}
}